

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

void __thiscall Database::drop_dataset(Database *this,string *dsname)

{
  __type_conflict2 _Var1;
  string *__lhs;
  iterator __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string_view_t fmt;
  string local_50;
  
  __position._M_current =
       (this->working_datasets).
       super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  do {
    while( true ) {
      if (__position._M_current ==
          (this->working_datasets).
          super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        return;
      }
      __lhs = OnDiskDataset::get_name_abi_cxx11_(*__position._M_current);
      _Var1 = std::operator==(__lhs,dsname);
      if (!_Var1) break;
LAB_0013a383:
      __position = std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>::erase
                             (&this->working_datasets,__position._M_current);
      fmt.size_ = (size_t)dsname;
      fmt.data_ = (char *)0x8;
      spdlog::info<std::__cxx11::string>((spdlog *)"DROP: {}",fmt,in_RCX);
    }
    OnDiskDataset::get_id_abi_cxx11_(&local_50,*__position._M_current);
    _Var1 = std::operator==(&local_50,dsname);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var1) goto LAB_0013a383;
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

void Database::drop_dataset(const std::string &dsname) {
    for (auto it = working_datasets.begin(); it != working_datasets.end();) {
        if ((*it)->get_name() == dsname || (*it)->get_id() == dsname) {
            it = working_datasets.erase(it);
            spdlog::info("DROP: {}", dsname);
        } else {
            ++it;
        }
    }
}